

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall
Clasp::UncoreMinimize::handleUnsat(UncoreMinimize *this,Solver *s,bool up,LitVec *param_3)

{
  undefined1 *puVar1;
  OptParams OVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 *puVar5;
  wsum_t wVar6;
  uint uVar7;
  
  if (this->enum_ != (DefaultMinimize *)0x0) {
    DefaultMinimize::relaxBound(this->enum_,true);
  }
  uVar7 = *(uint *)&this->field_0xec;
  OVar2 = this->options_;
  do {
    if ((uVar7 >> 0x1c & 1) == 0) {
      if (((s->conflict_).ebo_.size != 0) && ((((s->conflict_).ebo_.buf)->rep_ ^ 2) < 2)) {
        return false;
      }
      if ((this->todo_).next_ != 0) {
        this->lower_ = this->lower_ - (long)(this->todo_).minW_;
        (this->todo_).lits_.ebo_.size = 0;
        (this->todo_).minW_ = 0x7fffffff;
      }
      uVar4 = analyze(this,s);
      if (uVar4 == 0) {
        (this->todo_).lits_.ebo_.size = 0;
        (this->todo_).core_.ebo_.size = 0;
        (this->todo_).minW_ = 0x7fffffff;
        (this->todo_).last_ = 0;
        (this->todo_).next_ = 0;
        (this->todo_).step_ = 0;
        return false;
      }
      this->lower_ = this->lower_ + (long)(this->todo_).minW_;
      if ((this->field_0xef & 0x20) == 0) {
        if (((((uint)OVar2 & 0xe0) == 0) || (bVar3 = validLowerBound(this), !bVar3)) ||
           (bVar3 = Todo::shrinkNext(&this->todo_,this,'\x02'), !bVar3)) {
          resetTrim(this,s);
        }
        else {
          popPath(this,s,0);
        }
      }
      else {
        Todo::terminate(&this->todo_);
        for (puVar5 = &(this->todo_).lits_.ebo_.buf
                       [(ulong)(this->todo_).lits_.ebo_.size - (ulong)(uVar4 + 1)].id; *puVar5 != 0;
            puVar5 = puVar5 + 2) {
          puVar1 = &(this->litData_).ebo_.buf[*puVar5 - 1].field_0x4;
          *(uint *)puVar1 = *(uint *)puVar1 & 0xbfffffff;
        }
      }
      bVar3 = validLowerBound(this);
      uVar7 = *(uint *)&this->field_0xec;
      *(uint *)&this->field_0xec = uVar7 & 0xefffffff | (uint)!bVar3 << 0x1c;
      if ((up) && (wVar6 = SharedMinimizeData::incLower
                                     ((this->super_MinimizeConstraint).shared_,uVar7 & 0xfffffff,
                                      this->lower_), wVar6 == this->lower_)) {
        uVar7 = *(uint *)&this->field_0xec & 0xfffffff;
        (s->lower).level = uVar7;
        (s->lower).bound =
             wVar6 + (((this->super_MinimizeConstraint).shared_)->adjust_).ebo_.buf[uVar7];
      }
    }
    else {
      Solver::clearStopConflict(s);
      addNext(this,s,true);
    }
    uVar7 = *(uint *)&this->field_0xec;
    if ((uVar7 & 0x10000000) == 0 && (s->conflict_).ebo_.size == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool UncoreMinimize::handleUnsat(Solver& s, bool up, LitVec&) {
	assert(s.hasConflict());
	if (enum_) { enum_->relaxBound(true); }
	bool trimCore = options_.trim != 0u;
	do {
		if (next_ == 0) {
			if (s.hasStopConflict()) { return false; }
			if (todo_.shrink()) {
				lower_ -= todo_.weight();
				todo_.clear(false);
			}
			uint32 cs = analyze(s);
			if (!cs) {
				todo_.clear();
				return false;
			}
			lower_ += todo_.weight();
			if (disj_) { // preprocessing: remove assumptions and remember core
				todo_.terminate(); // null-terminate core
				for (Todo::const_iterator it = todo_.end() - (cs + 1); it->id; ++it) {
					getData(it->id).assume = 0;
				}
			}
			else if (trimCore && validLowerBound() && todo_.shrinkNext(*this, value_false)) {
				popPath(s, 0);
			}
			else {
				resetTrim(s);
			}
			next_ = !validLowerBound();
			if (up && shared_->incLower(level_, lower_) == lower_) {
				reportLower(s, level_, lower_);
			}
		}
		else {
			s.clearStopConflict();
			addNext(s);
		}
	} while (next_ || s.hasConflict());
	return true;
}